

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

void __thiscall MNS::Server::Server(Server *this)

{
  mapped_type *pmVar1;
  mapped_type *this_00;
  mapped_type *pmVar2;
  long in_RDI;
  nullptr_t in_stack_fffffffffffffda8;
  function<void_(MNS::SocketData_*)> *in_stack_fffffffffffffdb0;
  function<void_(MNS::SocketData_*)> *this_01;
  key_type *in_stack_fffffffffffffde8;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffdf0;
  
  std::function<void_()>::function((function<void_()> *)in_stack_fffffffffffffdb0);
  std::function<void_(MNS::SocketData_*)>::function(in_stack_fffffffffffffdb0);
  std::function<void_(MNS::SocketData_*)>::function(in_stack_fffffffffffffdb0);
  std::function<void_(MNS::SocketData_*)>::function(in_stack_fffffffffffffdb0);
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"100 Continue\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"101 Switching Protocols\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"102 Checkpoint\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"200 OK\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"201 Created\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"202 Accepted\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"203 Non-Authoritative Information\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"204 No Content\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"205 Reset Content\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"206 Partial Content\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"300 Multiple Choices\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"301 Moved Permanently\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"302 Found\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"303 See Other\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"304 Not Modified\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"306 Switch Proxy\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"307 Temporary Redirect\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"308 Resume Incomplete\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"400 Bad Request\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"401 Unauthorized\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"402 Payment Required\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"403 Forbidden\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"404 Not Found\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"405 Method Not Allowed\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"406 Not Acceptable\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"407 Proxy Authentication Required\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"408 Request Timeout\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"409 Conflict\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"410 Gone\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"411 Length Required\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"412 Precondition Failed\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"413 Request Entity Too Large\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"414 Request-URI Too Long\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"415 Unsupported Media Type\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"416 Requested Range Not Satisfiable\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)pmVar1,"417 Expectation Failed\r\n");
  this_00 = std::
            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)pmVar1,in_stack_fffffffffffffde8);
  std::__cxx11::string::operator=((string *)this_00,"500 Internal Server Error\r\n");
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pmVar1,(key_type *)this_00);
  std::__cxx11::string::operator=((string *)pmVar2,"501 Not Implemented\r\n");
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pmVar1,(key_type *)this_00);
  std::__cxx11::string::operator=((string *)pmVar2,"502 Bad Gateway\r\n");
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pmVar1,(key_type *)this_00);
  std::__cxx11::string::operator=((string *)pmVar2,"503 Service Unavailable\r\n");
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pmVar1,(key_type *)this_00);
  std::__cxx11::string::operator=((string *)pmVar2,"504 Gateway Timeout\r\n");
  pmVar2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pmVar1,(key_type *)this_00);
  std::__cxx11::string::operator=((string *)pmVar2,"505 HTTP Version Not Supported\r\n");
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pmVar1,(key_type *)this_00);
  std::__cxx11::string::operator=((string *)pmVar1,"511 Network Authentication Required\r\n");
  loop = (uv_loop_t *)uv_default_loop();
  this_01 = (function<void_(MNS::SocketData_*)> *)loop;
  std::function<void_(MNS::SocketData_*)>::operator=
            ((function<void_(MNS::SocketData_*)> *)loop,in_stack_fffffffffffffda8);
  std::function<void_(MNS::SocketData_*)>::operator=(this_01,in_stack_fffffffffffffda8);
  std::function<void_(MNS::SocketData_*)>::operator=(this_01,in_stack_fffffffffffffda8);
  *(undefined4 *)(in_RDI + 0x80) = 0;
  *(undefined8 *)(in_RDI + 0x88) = 0;
  return;
}

Assistant:

MNS::Server::Server() {
	MNS::Server::response_msgs[100] = "100 Continue\r\n";
	MNS::Server::response_msgs[101] = "101 Switching Protocols\r\n";
	MNS::Server::response_msgs[102] = "102 Checkpoint\r\n";

	MNS::Server::response_msgs[200] = "200 OK\r\n";
	MNS::Server::response_msgs[201] = "201 Created\r\n";
	MNS::Server::response_msgs[202] = "202 Accepted\r\n";
	MNS::Server::response_msgs[203] = "203 Non-Authoritative Information\r\n";
	MNS::Server::response_msgs[204] = "204 No Content\r\n";
	MNS::Server::response_msgs[205] = "205 Reset Content\r\n";
	MNS::Server::response_msgs[206] = "206 Partial Content\r\n";

	MNS::Server::response_msgs[300] = "300 Multiple Choices\r\n";
	MNS::Server::response_msgs[301] = "301 Moved Permanently\r\n";
	MNS::Server::response_msgs[302] = "302 Found\r\n";
	MNS::Server::response_msgs[303] = "303 See Other\r\n";
	MNS::Server::response_msgs[304] = "304 Not Modified\r\n";
	MNS::Server::response_msgs[306] = "306 Switch Proxy\r\n";
	MNS::Server::response_msgs[307] = "307 Temporary Redirect\r\n";
	MNS::Server::response_msgs[308] = "308 Resume Incomplete\r\n";


	MNS::Server::response_msgs[400] = "400 Bad Request\r\n";
	MNS::Server::response_msgs[401] = "401 Unauthorized\r\n";
	MNS::Server::response_msgs[402] = "402 Payment Required\r\n";
	MNS::Server::response_msgs[403] = "403 Forbidden\r\n";
	MNS::Server::response_msgs[404] = "404 Not Found\r\n";
	MNS::Server::response_msgs[405] = "405 Method Not Allowed\r\n";
	MNS::Server::response_msgs[406] = "406 Not Acceptable\r\n";
	MNS::Server::response_msgs[407] = "407 Proxy Authentication Required\r\n";
	MNS::Server::response_msgs[408] = "408 Request Timeout\r\n";
	MNS::Server::response_msgs[409] = "409 Conflict\r\n";
	MNS::Server::response_msgs[410] = "410 Gone\r\n";
	MNS::Server::response_msgs[411] = "411 Length Required\r\n";
	MNS::Server::response_msgs[412] = "412 Precondition Failed\r\n";
	MNS::Server::response_msgs[413] = "413 Request Entity Too Large\r\n";
	MNS::Server::response_msgs[414] = "414 Request-URI Too Long\r\n";
	MNS::Server::response_msgs[415] = "415 Unsupported Media Type\r\n";
	MNS::Server::response_msgs[416] = "416 Requested Range Not Satisfiable\r\n";
	MNS::Server::response_msgs[417] = "417 Expectation Failed\r\n";

	MNS::Server::response_msgs[500] = "500 Internal Server Error\r\n";
	MNS::Server::response_msgs[501] = "501 Not Implemented\r\n";
	MNS::Server::response_msgs[502] = "502 Bad Gateway\r\n";
	MNS::Server::response_msgs[503] = "503 Service Unavailable\r\n";
	MNS::Server::response_msgs[504] = "504 Gateway Timeout\r\n";
	MNS::Server::response_msgs[505] = "505 HTTP Version Not Supported\r\n";
	MNS::Server::response_msgs[511] = "511 Network Authentication Required\r\n";

	loop = uv_default_loop();

	this->onHttpCancelHandler = NULL;
	this->onHttpConnectionHandler = NULL;
	this->onHttpRequestHandler = NULL;
	this->listeningSocket = 0;
	this->timer_h = NULL;
}